

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haptic.c
# Opt level: O3

_Bool al_rumble_haptic(ALLEGRO_HAPTIC *hap,double intensity,double duration,
                      ALLEGRO_HAPTIC_EFFECT_ID *id)

{
  _Bool _Var1;
  ALLEGRO_HAPTIC_EFFECT effect;
  ALLEGRO_HAPTIC_EFFECT local_90;
  
  local_90.type = 1;
  local_90.replay.delay = 0.0;
  local_90.replay.length = duration;
  local_90.data.constant.level = intensity;
  local_90.data.constant.envelope.attack_length = intensity;
  _Var1 = (*haptic_driver->upload_effect)(hap,&local_90,id);
  if (_Var1) {
    _Var1 = (*haptic_driver->play_effect)(id,1);
    if (_Var1) {
      return true;
    }
    (*haptic_driver->release_effect)(id);
  }
  return false;
}

Assistant:

bool al_rumble_haptic(ALLEGRO_HAPTIC *hap,
   double intensity, double duration, ALLEGRO_HAPTIC_EFFECT_ID *id)
{
   ALLEGRO_HAPTIC_EFFECT effect;
   ASSERT(hap);
   ASSERT(id);

   effect.type = ALLEGRO_HAPTIC_RUMBLE;
   effect.data.rumble.strong_magnitude = intensity;
   effect.data.rumble.weak_magnitude = intensity;
   effect.replay.delay = 0.0;
   effect.replay.length = duration;
   return al_upload_and_play_haptic_effect(hap, &effect, id, 1);
}